

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.h
# Opt level: O1

void __thiscall
spvtools::val::BasicBlock::RegisterStructuralSuccessor(BasicBlock *this,BasicBlock *block)

{
  pointer *pppBVar1;
  iterator __position;
  BasicBlock *local_18;
  BasicBlock *local_10;
  
  local_18 = block;
  local_10 = this;
  std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
  emplace_back<spvtools::val::BasicBlock*>
            ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
             &block->structural_predecessors_,&local_10);
  __position._M_current =
       (this->structural_successors_).
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->structural_successors_).
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
    _M_realloc_insert<spvtools::val::BasicBlock*const&>
              ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
               &this->structural_successors_,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppBVar1 = &(this->structural_successors_).
                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  return;
}

Assistant:

void RegisterStructuralSuccessor(BasicBlock* block) {
    block->structural_predecessors_.push_back(this);
    structural_successors_.push_back(block);
  }